

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimStop(Sfm_Tim_t *p)

{
  Sfm_Tim_t *p_local;
  
  Vec_IntErase(&p->vTimArrs);
  Vec_IntErase(&p->vTimReqs);
  Vec_WecErase(&p->vLevels);
  Vec_IntErase(&p->vPath);
  Vec_WrdErase(&p->vSortData);
  if (p != (Sfm_Tim_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sfm_TimStop( Sfm_Tim_t * p )
{
    Vec_IntErase( &p->vTimArrs );
    Vec_IntErase( &p->vTimReqs );
    Vec_WecErase( &p->vLevels );
    Vec_IntErase( &p->vPath );
    Vec_WrdErase( &p->vSortData );
    ABC_FREE( p );
}